

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::StdinStream::StdinStream(StdinStream *this,string *targetName)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"file",&local_31);
  Stream::Stream((Stream *)
                 &(this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.
                  field_0x1020,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"file:name=/dev/stdin;mode=read;fd=0",&local_31);
  FileStream::FileStream(&this->super_FileStream,&PTR_construction_vtable_24__001259a8,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.
  super_SelectableStream._vptr_SelectableStream = (_func_int **)0x125910;
  *(undefined8 *)
   &(this->super_FileStream).super_FileDescriptorStream.super_DisconnectableStream.field_0x1020 =
       0x125978;
  return;
}

Assistant:

explicit StdinStream(const string& targetName) :
			Stream("file"),
			FileStream("file:name=/dev/stdin;mode=read;fd=0") {}